

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O1

bool __thiscall xray_re::xr_level_ai::load(xr_level_ai *this,char *key,char *name)

{
  int iVar1;
  xr_reader *r;
  
  if (xr_file_system::instance()::instance0 == '\0') {
    iVar1 = __cxa_guard_acquire(&xr_file_system::instance()::instance0);
    if (iVar1 != 0) {
      xr_file_system::xr_file_system(&xr_file_system::instance::instance0);
      __cxa_atexit(xr_file_system::~xr_file_system,&xr_file_system::instance::instance0,
                   &__dso_handle);
      __cxa_guard_release(&xr_file_system::instance()::instance0);
    }
  }
  r = xr_file_system::r_open(&xr_file_system::instance::instance0,key,name);
  if (r != (xr_reader *)0x0) {
    load(this,r);
    if (r->m_end < (r->field_2).m_p) {
      __assert_fail("m_p <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                    ,0x7e,"bool xray_re::xr_reader::eof() const");
    }
    if ((r->field_2).m_p != r->m_end) {
      __assert_fail("r->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_ai.cxx"
                    ,0x79,"bool xray_re::xr_level_ai::load(const char *, const char *)");
    }
    (*r->_vptr_xr_reader[1])(r);
  }
  return r != (xr_reader *)0x0;
}

Assistant:

bool xr_level_ai::load(const char* key, const char* name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(key, name);
	if (r == 0)
		return false;
	load(*r);
	assert(r->eof());
	fs.r_close(r);
	return true;
}